

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stats.c
# Opt level: O0

void mutex_stats_read_arena
               (uint arena_ind,mutex_prof_arena_ind_t mutex_ind,char *name,emitter_col_t *col_name,
               emitter_col_t *col_uint64_t,emitter_col_t *col_uint32_t,uint64_t uptime)

{
  long lVar1;
  int iVar2;
  uint64_t uVar3;
  long in_RCX;
  undefined8 in_RDX;
  uint in_EDI;
  long in_R8;
  long in_R9;
  size_t sz_6;
  size_t miblen_6;
  size_t mib_6 [7];
  size_t sz_5;
  size_t miblen_5;
  size_t mib_5 [7];
  emitter_col_t *base_4;
  size_t sz_4;
  size_t miblen_4;
  size_t mib_4 [7];
  emitter_col_t *base_3;
  size_t sz_3;
  size_t miblen_3;
  size_t mib_3 [7];
  emitter_col_t *base_2;
  size_t sz_2;
  size_t miblen_2;
  size_t mib_2 [7];
  emitter_col_t *base_1;
  size_t sz_1;
  size_t miblen_1;
  size_t mib_1 [7];
  emitter_col_t *base;
  size_t sz;
  size_t miblen;
  size_t mib [7];
  emitter_col_t *dst;
  char cmd [128];
  char *in_stack_fffffffffffffd28;
  size_t *in_stack_fffffffffffffd30;
  size_t *in_stack_fffffffffffffd38;
  char *in_stack_fffffffffffffd40;
  size_t *in_stack_fffffffffffffd48;
  void *in_stack_fffffffffffffd50;
  size_t in_stack_fffffffffffffd58;
  size_t *in_stack_fffffffffffffd60;
  undefined1 local_a8 [128];
  long local_28;
  long local_20;
  uint local_4;
  
  *(undefined8 *)(in_RCX + 0x10) = in_RDX;
  *(undefined4 *)(in_R8 + 8) = 4;
  local_28 = in_R9;
  local_20 = in_R8;
  local_4 = in_EDI;
  gen_mutex_ctl_str(in_stack_fffffffffffffd40,(size_t)in_stack_fffffffffffffd38,
                    (char *)in_stack_fffffffffffffd30,in_stack_fffffffffffffd28,(char *)0x263044);
  iVar2 = je_mallctlnametomib(in_stack_fffffffffffffd40,in_stack_fffffffffffffd38,
                              in_stack_fffffffffffffd30);
  if (iVar2 != 0) {
    malloc_printf("<jemalloc>: Failure in xmallctlnametomib(\"%s\", ...)\n",local_a8);
    abort();
  }
  iVar2 = je_mallctlbymib(in_stack_fffffffffffffd60,in_stack_fffffffffffffd58,
                          in_stack_fffffffffffffd50,in_stack_fffffffffffffd48,
                          in_stack_fffffffffffffd40,(size_t)in_stack_fffffffffffffd38);
  lVar1 = local_20;
  if (iVar2 != 0) {
    malloc_write((char *)0x2630ec);
    abort();
  }
  *(undefined4 *)(local_20 + 0x30) = 4;
  uVar3 = rate_per_second(*(uint64_t *)(local_20 + 0x10),miblen_6);
  *(uint64_t *)(lVar1 + 0x38) = uVar3;
  *(undefined4 *)(local_20 + 0x58) = 4;
  gen_mutex_ctl_str(in_stack_fffffffffffffd40,(size_t)in_stack_fffffffffffffd38,
                    (char *)in_stack_fffffffffffffd30,in_stack_fffffffffffffd28,(char *)0x2631a7);
  iVar2 = je_mallctlnametomib(in_stack_fffffffffffffd40,in_stack_fffffffffffffd38,
                              in_stack_fffffffffffffd30);
  if (iVar2 != 0) {
    malloc_printf("<jemalloc>: Failure in xmallctlnametomib(\"%s\", ...)\n",local_a8);
    abort();
  }
  iVar2 = je_mallctlbymib(in_stack_fffffffffffffd60,in_stack_fffffffffffffd58,
                          in_stack_fffffffffffffd50,in_stack_fffffffffffffd48,
                          in_stack_fffffffffffffd40,(size_t)in_stack_fffffffffffffd38);
  lVar1 = local_20;
  if (iVar2 != 0) {
    malloc_write((char *)0x26324f);
    abort();
  }
  *(undefined4 *)(local_20 + 0x80) = 4;
  uVar3 = rate_per_second(*(uint64_t *)(local_20 + 0x60),miblen_6);
  *(uint64_t *)(lVar1 + 0x88) = uVar3;
  *(undefined4 *)(local_20 + 0xa8) = 4;
  gen_mutex_ctl_str(in_stack_fffffffffffffd40,(size_t)in_stack_fffffffffffffd38,
                    (char *)in_stack_fffffffffffffd30,in_stack_fffffffffffffd28,(char *)0x263310);
  iVar2 = je_mallctlnametomib(in_stack_fffffffffffffd40,in_stack_fffffffffffffd38,
                              in_stack_fffffffffffffd30);
  if (iVar2 != 0) {
    malloc_printf("<jemalloc>: Failure in xmallctlnametomib(\"%s\", ...)\n",local_a8);
    abort();
  }
  iVar2 = je_mallctlbymib(in_stack_fffffffffffffd60,in_stack_fffffffffffffd58,
                          in_stack_fffffffffffffd50,in_stack_fffffffffffffd48,
                          in_stack_fffffffffffffd40,(size_t)in_stack_fffffffffffffd38);
  lVar1 = local_20;
  if (iVar2 != 0) {
    malloc_write((char *)0x2633b8);
    abort();
  }
  *(undefined4 *)(local_20 + 0xd0) = 4;
  uVar3 = rate_per_second(*(uint64_t *)(local_20 + 0xb0),miblen_6);
  *(uint64_t *)(lVar1 + 0xd8) = uVar3;
  *(undefined4 *)(local_20 + 0xf8) = 4;
  gen_mutex_ctl_str(in_stack_fffffffffffffd40,(size_t)in_stack_fffffffffffffd38,
                    (char *)in_stack_fffffffffffffd30,in_stack_fffffffffffffd28,(char *)0x26347d);
  iVar2 = je_mallctlnametomib(in_stack_fffffffffffffd40,in_stack_fffffffffffffd38,
                              in_stack_fffffffffffffd30);
  if (iVar2 != 0) {
    malloc_printf("<jemalloc>: Failure in xmallctlnametomib(\"%s\", ...)\n",local_a8);
    abort();
  }
  iVar2 = je_mallctlbymib(in_stack_fffffffffffffd60,in_stack_fffffffffffffd58,
                          in_stack_fffffffffffffd50,in_stack_fffffffffffffd48,
                          in_stack_fffffffffffffd40,(size_t)in_stack_fffffffffffffd38);
  lVar1 = local_20;
  if (iVar2 != 0) {
    malloc_write((char *)0x263525);
    abort();
  }
  *(undefined4 *)(local_20 + 0x120) = 4;
  uVar3 = rate_per_second(*(uint64_t *)(local_20 + 0x100),miblen_6);
  *(uint64_t *)(lVar1 + 0x128) = uVar3;
  *(undefined4 *)(local_20 + 0x148) = 4;
  gen_mutex_ctl_str(in_stack_fffffffffffffd40,(size_t)in_stack_fffffffffffffd38,
                    (char *)in_stack_fffffffffffffd30,in_stack_fffffffffffffd28,(char *)0x2635ea);
  iVar2 = je_mallctlnametomib(in_stack_fffffffffffffd40,in_stack_fffffffffffffd38,
                              in_stack_fffffffffffffd30);
  if (iVar2 != 0) {
    malloc_printf("<jemalloc>: Failure in xmallctlnametomib(\"%s\", ...)\n",local_a8);
    abort();
  }
  iVar2 = je_mallctlbymib(in_stack_fffffffffffffd60,in_stack_fffffffffffffd58,
                          in_stack_fffffffffffffd50,in_stack_fffffffffffffd48,
                          in_stack_fffffffffffffd40,(size_t)in_stack_fffffffffffffd38);
  lVar1 = local_20;
  if (iVar2 != 0) {
    malloc_write((char *)0x263692);
    abort();
  }
  *(undefined4 *)(local_20 + 0x170) = 4;
  uVar3 = rate_per_second(*(uint64_t *)(local_20 + 0x150),miblen_6);
  *(uint64_t *)(lVar1 + 0x178) = uVar3;
  *(undefined4 *)(local_20 + 0x198) = 4;
  gen_mutex_ctl_str(in_stack_fffffffffffffd40,(size_t)in_stack_fffffffffffffd38,
                    (char *)in_stack_fffffffffffffd30,in_stack_fffffffffffffd28,(char *)0x263757);
  iVar2 = je_mallctlnametomib(in_stack_fffffffffffffd40,in_stack_fffffffffffffd38,
                              in_stack_fffffffffffffd30);
  if (iVar2 != 0) {
    malloc_printf("<jemalloc>: Failure in xmallctlnametomib(\"%s\", ...)\n",local_a8);
    abort();
  }
  iVar2 = je_mallctlbymib(in_stack_fffffffffffffd60,in_stack_fffffffffffffd58,
                          in_stack_fffffffffffffd50,in_stack_fffffffffffffd48,
                          in_stack_fffffffffffffd40,(size_t)in_stack_fffffffffffffd38);
  if (iVar2 != 0) {
    malloc_write((char *)0x2637e7);
    abort();
  }
  *(undefined4 *)(local_28 + 8) = 3;
  gen_mutex_ctl_str(in_stack_fffffffffffffd40,(size_t)in_stack_fffffffffffffd38,
                    (char *)in_stack_fffffffffffffd30,in_stack_fffffffffffffd28,(char *)0x263843);
  iVar2 = je_mallctlnametomib(in_stack_fffffffffffffd40,in_stack_fffffffffffffd38,(size_t *)0x7);
  if (iVar2 != 0) {
    malloc_printf("<jemalloc>: Failure in xmallctlnametomib(\"%s\", ...)\n",local_a8);
    abort();
  }
  iVar2 = je_mallctlbymib(in_stack_fffffffffffffd60,in_stack_fffffffffffffd58,
                          in_stack_fffffffffffffd50,(size_t *)(ulong)local_4,
                          in_stack_fffffffffffffd40,(size_t)in_stack_fffffffffffffd38);
  if (iVar2 != 0) {
    malloc_write((char *)0x2638d0);
    abort();
  }
  return;
}

Assistant:

static void
mutex_stats_read_arena(unsigned arena_ind, mutex_prof_arena_ind_t mutex_ind,
    const char *name, emitter_col_t *col_name,
    emitter_col_t col_uint64_t[mutex_prof_num_uint64_t_counters],
    emitter_col_t col_uint32_t[mutex_prof_num_uint32_t_counters],
    uint64_t uptime) {
	char cmd[MUTEX_CTL_STR_MAX_LENGTH];

	col_name->str_val = name;

	emitter_col_t *dst;
#define EMITTER_TYPE_uint32_t emitter_type_uint32
#define EMITTER_TYPE_uint64_t emitter_type_uint64
#define OP(counter, counter_type, human, derived, base_counter)	\
	dst = &col_##counter_type[mutex_counter_##counter];		\
	dst->type = EMITTER_TYPE_##counter_type;			\
	if (!derived) {                                   \
		gen_mutex_ctl_str(cmd, MUTEX_CTL_STR_MAX_LENGTH,        \
		    "arenas.0.mutexes", arena_mutex_names[mutex_ind], #counter);\
		CTL_M2_GET(cmd, arena_ind, (counter_type *)&dst->bool_val, counter_type); \
	} else {                      \
		emitter_col_t *base = &col_##counter_type[mutex_counter_##base_counter];	\
		dst->counter_type##_val = rate_per_second(base->counter_type##_val, uptime); \
	}
	MUTEX_PROF_COUNTERS
#undef OP
#undef EMITTER_TYPE_uint32_t
#undef EMITTER_TYPE_uint64_t
}